

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * pugi::impl::anon_unknown_0::
         strconv_pcdata_impl<pugi::impl::(anonymous_namespace)::opt_true,_pugi::impl::(anonymous_namespace)::opt_true,_pugi::impl::(anonymous_namespace)::opt_false>
         ::parse(char_t *s)

{
  byte bVar1;
  byte *pbVar2;
  long lVar3;
  byte *pbVar4;
  byte *pbVar5;
  bool bVar6;
  
  pbVar5 = (byte *)0x0;
  lVar3 = 0;
  pbVar2 = (byte *)s;
LAB_00331f7f:
  do {
    pbVar4 = pbVar2;
    if (((anonymous_namespace)::chartype_table[*pbVar4] & 1) == 0) {
      if (((anonymous_namespace)::chartype_table[pbVar4[1]] & 1) != 0) {
        pbVar4 = pbVar4 + 1;
        goto LAB_00331fca;
      }
      if (((anonymous_namespace)::chartype_table[pbVar4[2]] & 1) != 0) {
        pbVar4 = pbVar4 + 2;
        goto LAB_00331fca;
      }
      bVar6 = ((anonymous_namespace)::chartype_table[pbVar4[3]] & 1) == 0;
      if (bVar6) {
        pbVar4 = pbVar4 + 4;
      }
      else {
        pbVar4 = pbVar4 + 3;
      }
    }
    else {
LAB_00331fca:
      bVar6 = false;
    }
    pbVar2 = pbVar4;
  } while (bVar6);
  bVar1 = *pbVar4;
  if (bVar1 == 0xd) {
    *pbVar4 = 10;
    pbVar2 = pbVar4 + 1;
    if (pbVar4[1] == 10) {
      if (pbVar5 != (byte *)0x0) {
        memmove(pbVar5 + -lVar3,pbVar5,(long)(pbVar4 + 1) - (long)pbVar5);
      }
      pbVar5 = pbVar4 + 2;
      lVar3 = lVar3 + 1;
      pbVar2 = pbVar5;
    }
    goto LAB_00331f7f;
  }
  if (bVar1 == 0) {
    if (pbVar5 != (byte *)0x0) {
      memmove(pbVar5 + -lVar3,pbVar5,(long)pbVar4 - (long)pbVar5);
      pbVar2 = pbVar4 + -lVar3;
    }
    goto LAB_00332079;
  }
  if (bVar1 != 0x3c) {
    pbVar2 = pbVar4 + 1;
    goto LAB_00331f7f;
  }
  if (pbVar5 != (byte *)0x0) {
    memmove(pbVar5 + -lVar3,pbVar5,(long)pbVar4 - (long)pbVar5);
    pbVar2 = pbVar4 + -lVar3;
  }
  do {
    pbVar5 = pbVar2;
    if (pbVar5 <= s) break;
    pbVar2 = pbVar5 + -1;
  } while (((anonymous_namespace)::chartype_table[pbVar5[-1]] & 8) != 0);
  *pbVar5 = 0;
  return (char_t *)(pbVar4 + 1);
  while (pbVar2 = pbVar5 + -1, ((anonymous_namespace)::chartype_table[pbVar5[-1]] & 8) != 0) {
LAB_00332079:
    pbVar5 = pbVar2;
    if (pbVar5 <= s) break;
  }
  *pbVar5 = 0;
  return (char_t *)pbVar4;
}

Assistant:

static char_t* parse(char_t* s)
		{
			gap g;

			char_t* begin = s;

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_pcdata));

				if (*s == '<') // PCDATA ends here
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s + 1;
				}
				else if (opt_eol::value && *s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
				{
					*s++ = '\n'; // replace first one with 0x0a

					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (*s == 0)
				{
					char_t* end = g.flush(s);

					if (opt_trim::value)
						while (end > begin && PUGI_IMPL_IS_CHARTYPE(end[-1], ct_space))
							--end;

					*end = 0;

					return s;
				}
				else ++s;
			}
		}